

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_format.cc
# Opt level: O1

lts_20240722 *
absl::lts_20240722::log_internal::FormatLogMessage_abi_cxx11_
          (LogSeverity severity,CivilSecond civil_second,Duration subsecond,Tid tid,
          string_view basename,int line,PrefixFormat format,string_view message)

{
  int iVar1;
  undefined4 in_register_0000003c;
  char *args;
  Duration DVar2;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  FormatSpec<char,_int,_int,_int,_int,_int,_long,_int,_std::basic_string_view<char>,_int,_const_char_*,_std::basic_string_view<char>_>
  local_50;
  char *local_40;
  long local_38;
  
  iVar1 = (int)message._M_len;
  DVar2.rep_hi_.hi_ = (uint32_t)((ulong)register0x00000080 >> 0x20);
  DVar2.rep_hi_.lo_ = subsecond.rep_lo_;
  local_50.super_type.spec_.data_ = "%c%02d%02d %02d:%02d:%02d.%06d %7d %s:%d] %s%s";
  local_50.super_type.spec_.size_ = 0x2e;
  if ((uint)civil_second.f_.y < 4) {
    args = (&PTR_anon_var_dwarf_88_00104ca8)[(uint)civil_second.f_.y];
  }
  else {
    args = "UNKNOWN";
  }
  local_60 = (int)(char)subsecond.rep_hi_.lo_;
  local_54 = (int)subsecond.rep_hi_.lo_._1_1_;
  local_58 = (int)subsecond.rep_hi_.lo_._2_1_;
  local_64 = (int)subsecond.rep_hi_.lo_ >> 0x18;
  local_5c = subsecond.rep_hi_._1_4_ >> 0x18;
  DVar2.rep_lo_ = tid;
  local_38 = absl::lts_20240722::ToInt64Microseconds(DVar2);
  local_40 = "";
  if (iVar1 == 1) {
    local_40 = "RAW: ";
  }
  StrFormat<char,_int,_int,_int,_int,_int,_long,_int,_std::basic_string_view<char,_std::char_traits<char>_>,_int,_const_char_*,_std::basic_string_view<char,_std::char_traits<char>_>_>
            ((lts_20240722 *)CONCAT44(in_register_0000003c,severity),&local_50,args,&local_60,
             &local_54,&local_58,&local_64,&local_5c,&local_38,(int *)&basename,
             (basic_string_view<char,_std::char_traits<char>_> *)&basename._M_str,(int *)&format,
             &local_40,(basic_string_view<char,_std::char_traits<char>_> *)&message._M_str);
  return (lts_20240722 *)CONCAT44(in_register_0000003c,severity);
}

Assistant:

std::string FormatLogMessage(absl::LogSeverity severity,
                             absl::CivilSecond civil_second,
                             absl::Duration subsecond, log_internal::Tid tid,
                             absl::string_view basename, int line,
                             PrefixFormat format, absl::string_view message) {
  return absl::StrFormat(
      "%c%02d%02d %02d:%02d:%02d.%06d %7d %s:%d] %s%s",
      absl::LogSeverityName(severity)[0], civil_second.month(),
      civil_second.day(), civil_second.hour(), civil_second.minute(),
      civil_second.second(), absl::ToInt64Microseconds(subsecond), tid,
      basename, line, format == PrefixFormat::kRaw ? "RAW: " : "", message);
}